

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O2

void __thiscall CTPNStmSwitch::gen_code(CTPNStmSwitch *this,int param_1,int param_2)

{
  CTPNStmEnclosing *pCVar1;
  CTcPrsNode *pCVar2;
  CTPNStmSwitch *pCVar3;
  CTPNStm *substm;
  CTcCodeStream *pCVar4;
  uint uVar5;
  CTcCodeLabel *lbl;
  CTPNStmSwitch *__n;
  int iVar6;
  char buf [7];
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  pCVar1 = G_cs->enclosing_;
  G_cs->enclosing_ = (CTPNStmEnclosing *)this;
  pCVar2 = (this->super_CTPNStmSwitchBase).expr_;
  iVar6 = 0;
  (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar2,0,0);
  pCVar3 = G_cs->cur_switch_;
  G_cs->cur_switch_ = this;
  __n = pCVar3;
  uVar5 = (*(this->super_CTPNStmSwitchBase).super_CTPNStmEnclosing.super_CTPNStm.super_CTPNStmBase.
            super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1c])(this,0);
  if ((uVar5 & 1) == 0) {
    lbl = (CTcCodeLabel *)0x0;
  }
  else {
    lbl = CTcCodeStream::new_label_fwd(G_cs);
  }
  this->break_lbl_ = lbl;
  CTcGenTarg::write_op(G_cg,0x90);
  G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  CTcDataStream::write2(&G_cs->super_CTcDataStream,(this->super_CTPNStmSwitchBase).case_cnt_);
  this->case_slot_ofs_ = (G_cs->super_CTcDataStream).ofs_;
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  for (; pCVar4 = G_cs, iVar6 < (this->super_CTPNStmSwitchBase).case_cnt_; iVar6 = iVar6 + 1) {
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)buf,(void *)0x7,(size_t)__n);
  }
  if (((this->super_CTPNStmSwitchBase).field_0x3c & 1) == 0) {
    CTcCodeStream::write_ofs2(G_cs,lbl,0);
  }
  else {
    this->default_slot_ofs_ = (G_cs->super_CTcDataStream).ofs_;
    CTcDataStream::write2(&pCVar4->super_CTcDataStream,0);
  }
  substm = (this->super_CTPNStmSwitchBase).body_;
  if (substm != (CTPNStm *)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)this,substm);
  }
  if (lbl != (CTcCodeLabel *)0x0) {
    CTcPrsNode::def_label_pos(lbl);
  }
  pCVar4 = G_cs;
  G_cs->cur_switch_ = pCVar3;
  pCVar4->enclosing_ = pCVar1;
  return;
}

Assistant:

void CTPNStmSwitch::gen_code(int, int)
{
    CTPNStmSwitch *enclosing_switch;
    int i;
    char buf[VMB_DATAHOLDER + VMB_UINT2];
    CTcCodeLabel *end_lbl;
    CTPNStmEnclosing *old_enclosing;

    /* add a line record */
    add_debug_line_rec();

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);

    /* 
     *   Generate the controlling expression.  We want to keep the value,
     *   hence 'discard' is false, and we need assignment (not 'for
     *   condition') conversion rules, because we're going to use the
     *   value in direct comparisons 
     */
    expr_->gen_code(FALSE, FALSE);

    /* make myself the current innermost switch */
    enclosing_switch = G_cs->set_switch(this);

    /*
     *   if we can flow out of the switch, allocate a label for the end of
     *   the switch body 
     */
    if ((get_control_flow(FALSE) & TCPRS_FLOW_NEXT) != 0)
        end_lbl = G_cs->new_label_fwd();
    else
        end_lbl = 0;

    /* the end label is the 'break' location for subnodes */
    break_lbl_ = end_lbl;

    /*
     *   Write my SWITCH opcode, and the placeholder case table.  We'll
     *   fill in the case table with its real values as we encounter the
     *   cases in the course of generating the code.  For now, all we know
     *   is the number of cases we need to put into the table.  
     */
    G_cg->write_op(OPC_SWITCH);

    /* the SWITCH opcode pops the controlling expression value */
    G_cg->note_pop();

    /* write the number of cases */
    G_cs->write2(case_cnt_);

    /* 
     *   remember where the first case slot is - the 'case' parse nodes
     *   will use this to figure out where to write their slot data 
     */
    case_slot_ofs_ = G_cs->get_ofs();

    /* 
     *   Write the placeholder case slots - each case slot gets a
     *   DATA_HOLDER for the case value, plus an INT2 for the branch
     *   offset.  For now, completely zero each case slot.  
     */
    memset(buf, 0, VMB_DATAHOLDER + VMB_UINT2);
    for (i = 0 ; i < case_cnt_ ; ++i)
        G_cs->write(buf, VMB_DATAHOLDER + VMB_UINT2);

    /* write a placeholder for the default jump */
    if (has_default_)
    {
        /* 
         *   remember where the 'default' slot is, so that the 'default'
         *   parse node can figure out where to write its branch offset
         */
        default_slot_ofs_ = G_cs->get_ofs();
        
        /* 
         *   Write the placeholder for the 'default' slot - this just gets
         *   an INT2 for the 'default' jump offset.  As with the case
         *   labels, just zero it for now; we'll fill it in later when we
         *   encounter the 'default' case.  
         */
        G_cs->write2(0);
    }
    else
    {
        /* 
         *   there's no default slot, so the 'default' slot is simply a
         *   jump to the end of the switch body - generate a jump ahead to
         *   our end label 
         */
        G_cs->write_ofs2(end_lbl, 0);
    }

    /* 
     *   generate the switch body - this will fill in the case table as we
     *   encounter the 'case' nodes in the parse tree
     */
    if (body_ != 0)
        gen_code_substm(body_);

    /* 
     *   We're past the body - if we have an end label, set it here.  (We
     *   won't have created an end label if control can't flow out of the
     *   switch; this allows us to avoid generating unreachable instructions
     *   after the switch, which would only increase the code size for no
     *   reason.)  
     */
    if (end_lbl != 0)
        def_label_pos(end_lbl);

    /* restore the enclosing switch */
    G_cs->set_switch(enclosing_switch);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}